

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.h
# Opt level: O2

char16_t * icu_63::UCharsTrie::jumpByDelta(char16_t *pos)

{
  char16_t cVar1;
  uint uVar2;
  char16_t *pcVar3;
  
  cVar1 = *pos;
  uVar2 = (uint)(ushort)cVar1;
  if ((ushort)cVar1 < 0xfc00) {
    pcVar3 = pos + 1;
  }
  else if (cVar1 == L'\xffff') {
    uVar2 = CONCAT22(pos[1],pos[2]);
    pcVar3 = pos + 3;
  }
  else {
    pcVar3 = pos + 2;
    uVar2 = (uint)(ushort)cVar1 * 0x10000 + (uint)(ushort)pos[1] + 0x4000000;
  }
  return pcVar3 + (int)uVar2;
}

Assistant:

static inline const char16_t *jumpByDelta(const char16_t *pos) {
        int32_t delta=*pos++;
        if(delta>=kMinTwoUnitDeltaLead) {
            if(delta==kThreeUnitDeltaLead) {
                delta=(pos[0]<<16)|pos[1];
                pos+=2;
            } else {
                delta=((delta-kMinTwoUnitDeltaLead)<<16)|*pos++;
            }
        }
        return pos+delta;
    }